

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

bool libcellml::Variable::addEquivalence
               (VariablePtr *variable1,VariablePtr *variable2,string *mappingId,string *connectionId
               )

{
  bool bVar1;
  
  bVar1 = addEquivalence(variable1,variable2);
  VariableImpl::setEquivalentMappingId
            ((VariableImpl *)
             (((variable1->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,variable2,
             mappingId);
  VariableImpl::setEquivalentConnectionId
            ((VariableImpl *)
             (((variable1->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,variable2,
             connectionId);
  VariableImpl::setEquivalentMappingId
            ((VariableImpl *)
             (((variable2->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,variable1,
             mappingId);
  VariableImpl::setEquivalentConnectionId
            ((VariableImpl *)
             (((variable2->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,variable1,
             connectionId);
  return bVar1;
}

Assistant:

bool Variable::addEquivalence(const VariablePtr &variable1, const VariablePtr &variable2, const std::string &mappingId, const std::string &connectionId)
{
    bool added = Variable::addEquivalence(variable1, variable2);
    variable1->pFunc()->setEquivalentMappingId(variable2, mappingId);
    variable1->pFunc()->setEquivalentConnectionId(variable2, connectionId);
    variable2->pFunc()->setEquivalentMappingId(variable1, mappingId);
    variable2->pFunc()->setEquivalentConnectionId(variable1, connectionId);

    return added;
}